

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
parseDeviceOrModuleJson(BUFFER_HANDLE jsonBuffer,IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  JSON_Status JVar1;
  LOGGER_LOG p_Var2;
  uchar *string;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  JSON_Object *pJStack_48;
  JSON_Status jsonStatus;
  JSON_Object *root_object;
  JSON_Value *root_value;
  char *bufferStr;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_local;
  BUFFER_HANDLE jsonBuffer_local;
  
  if (jsonBuffer == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleJson",0x2c9,1,"jsonBuffer cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  else if (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleJson",0x2ce,1,"deviceOrModuleInfo cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  else {
    root_object = (JSON_Object *)0x0;
    pJStack_48 = (JSON_Object *)0x0;
    string = BUFFER_u_char(jsonBuffer);
    if (string == (uchar *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"parseDeviceOrModuleJson",0x2da,1,"BUFFER_u_char failed");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else {
      root_object = (JSON_Object *)json_parse_string((char *)string);
      if (root_object == (JSON_Object *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleJson",0x2df,1,"json_parse_string failed");
        }
        l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
      }
      else {
        pJStack_48 = json_value_get_object((JSON_Value *)root_object);
        if (pJStack_48 == (JSON_Object *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"parseDeviceOrModuleJson",0x2e4,1,"json_value_get_object failed");
          }
          l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else {
          l._4_4_ = parseDeviceOrModuleJsonObject(pJStack_48,deviceOrModuleInfo);
        }
      }
    }
    JVar1 = json_object_clear(pJStack_48);
    if (JVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"parseDeviceOrModuleJson",0x2ee,1,"json_object_clear failed");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    json_value_free((JSON_Value *)root_object);
    if (l._4_4_ != IOTHUB_REGISTRYMANAGER_OK) {
      free_deviceOrModule_members(deviceOrModuleInfo);
    }
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT parseDeviceOrModuleJson(BUFFER_HANDLE jsonBuffer, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (jsonBuffer == NULL)
    {
        LogError("jsonBuffer cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if (deviceOrModuleInfo == NULL)
    {
        LogError("deviceOrModuleInfo cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else
    {
        const char* bufferStr = NULL;
        JSON_Value* root_value = NULL;
        JSON_Object* root_object = NULL;
        JSON_Status jsonStatus;

        if ((bufferStr = (const char*)BUFFER_u_char(jsonBuffer)) == NULL)
        {
            LogError("BUFFER_u_char failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else if ((root_value = json_parse_string(bufferStr)) == NULL)
        {
            LogError("json_parse_string failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else if ((root_object = json_value_get_object(root_value)) == NULL)
        {
            LogError("json_value_get_object failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else
        {
            result = parseDeviceOrModuleJsonObject(root_object, deviceOrModuleInfo);
        }

        if ((jsonStatus = json_object_clear(root_object)) != JSONSuccess)
        {
            LogError("json_object_clear failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }

        json_value_free(root_value);

        if (result != IOTHUB_REGISTRYMANAGER_OK)
        {
            free_deviceOrModule_members(deviceOrModuleInfo);
        }
    }
    return result;
}